

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(short lhs,SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs
         )

{
  bool bVar1;
  uchar uVar2;
  uchar in_SIL;
  short in_DI;
  short ret;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  short *in_stack_ffffffffffffffe8;
  undefined5 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff5;
  undefined2 uVar3;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_5;
  short local_4;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2;
  uchar local_1;
  
  local_4 = in_DI;
  local_2.m_int = in_SIL;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_5);
  bVar1 = DivisionCornerCaseHelper<unsigned_char,_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1(local_4,local_2,&local_5);
  if (bVar1) {
    local_1 = local_5.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<unsigned_char,_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::DivisionCornerCase2(local_4,local_2,&local_5);
    if (bVar1) {
      local_1 = local_5.m_int;
    }
    else {
      uVar3 = 0;
      uVar2 = SafeInt::operator_cast_to_unsigned_char
                        ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)(ulong)CONCAT15(in_stack_fffffffffffffff5,in_stack_fffffffffffffff0));
      DivisionHelper<short,_unsigned_char,_4>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((short *)CONCAT26(uVar3,CONCAT15(uVar2,in_stack_fffffffffffffff0)),
                 (uchar *)in_stack_ffffffffffffffe8,(short *)0x130764);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>
                ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT26(uVar3,CONCAT15(uVar2,in_stack_fffffffffffffff0)),in_stack_ffffffffffffffe8
                );
    }
  }
  return (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_1;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}